

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accel.h
# Opt level: O2

void __thiscall embree::Accel::Intersectors::print(Intersectors *this,size_t ident)

{
  ostream *poVar1;
  size_t sVar2;
  bool bVar3;
  
  sVar2 = ident;
  if ((this->collider).name != (char *)0x0) {
    while (sVar2 != 0) {
      std::operator<<((ostream *)&std::cout," ");
      sVar2 = sVar2 - 1;
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"collider  = ");
    poVar1 = std::operator<<(poVar1,(this->collider).name);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  sVar2 = ident;
  if ((this->intersector1).name != (char *)0x0) {
    while (sVar2 != 0) {
      std::operator<<((ostream *)&std::cout," ");
      sVar2 = sVar2 - 1;
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"intersector1  = ");
    poVar1 = std::operator<<(poVar1,(this->intersector1).name);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  sVar2 = ident;
  if ((this->intersector4).name != (char *)0x0) {
    while (sVar2 != 0) {
      std::operator<<((ostream *)&std::cout," ");
      sVar2 = sVar2 - 1;
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"intersector4  = ");
    poVar1 = std::operator<<(poVar1,(this->intersector4).name);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  sVar2 = ident;
  if ((this->intersector8).name != (char *)0x0) {
    while (sVar2 != 0) {
      std::operator<<((ostream *)&std::cout," ");
      sVar2 = sVar2 - 1;
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"intersector8  = ");
    poVar1 = std::operator<<(poVar1,(this->intersector8).name);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  if ((this->intersector16).name == (char *)0x0) {
    return;
  }
  while (bVar3 = ident != 0, ident = ident - 1, bVar3) {
    std::operator<<((ostream *)&std::cout," ");
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"intersector16 = ");
  poVar1 = std::operator<<(poVar1,(this->intersector16).name);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void print(size_t ident) 
      {
        if (collider.name) {
          for (size_t i=0; i<ident; i++) std::cout << " ";
          std::cout << "collider  = " << collider.name << std::endl;
        }
        if (intersector1.name) {
          for (size_t i=0; i<ident; i++) std::cout << " ";
          std::cout << "intersector1  = " << intersector1.name << std::endl;
        }
        if (intersector4.name) {
          for (size_t i=0; i<ident; i++) std::cout << " ";
          std::cout << "intersector4  = " << intersector4.name << std::endl;
        }
        if (intersector8.name) {
          for (size_t i=0; i<ident; i++) std::cout << " ";
          std::cout << "intersector8  = " << intersector8.name << std::endl;
        }
        if (intersector16.name) {
          for (size_t i=0; i<ident; i++) std::cout << " ";
          std::cout << "intersector16 = " << intersector16.name << std::endl;
        }
      }